

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::tracker_manager::incoming_packet
          (tracker_manager *this,string_view hostname,span<const_char> buf)

{
  session_logger *psVar1;
  span<const_char> buf_00;
  string_view hostname_00;
  bool bVar2;
  index_type iVar3;
  undefined8 uVar4;
  pointer ppVar5;
  element_type *this_00;
  undefined1 local_a8 [8];
  shared_ptr<libtorrent::aux::udp_tracker_connection> p;
  allocator<char> local_81;
  string local_80 [32];
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
  local_60;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
  local_58;
  iterator i;
  uint32_t transaction;
  uint32_t action;
  span<const_char> ptr;
  tracker_manager *this_local;
  span<const_char> buf_local;
  string_view hostname_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (tracker_manager *)buf.m_ptr;
  buf_local.m_len = hostname._M_len;
  ptr.m_len = (difference_type)this;
  iVar3 = span<const_char>::size((span<const_char> *)&this_local);
  if (iVar3 < 0x10) {
    hostname_local._M_str._7_1_ = false;
  }
  else {
    _transaction = this_local;
    ptr.m_ptr = buf_local.m_ptr;
    i.
    super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
    ._M_cur._4_4_ = read_uint32<char_const>((span<const_char> *)&transaction);
    if (i.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
        ._M_cur._4_4_ < 4) {
      i.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
      ._M_cur._0_4_ = read_uint32<char_const>((span<const_char> *)&transaction);
      local_58._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>_>
           ::find(&this->m_udp_conns,(key_type *)&i);
      local_60._M_cur =
           (__node_type *)
           ::std::
           unordered_map<unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>_>_>
           ::end(&this->m_udp_conns);
      bVar2 = ::std::__detail::operator==(&local_58,&local_60);
      if (bVar2) {
        psVar1 = this->m_ses;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_80,(basic_string_view<char,_std::char_traits<char>_> *)&buf_local.m_len,
                   &local_81);
        uVar4 = ::std::__cxx11::string::c_str();
        (*psVar1->_vptr_session_logger[1])
                  (psVar1,"incoming UDP tracker packet from %s has invalid transaction ID (%x)",
                   uVar4,(ulong)(uint32_t)
                                i.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false>
                                ._M_cur);
        ::std::__cxx11::string::~string(local_80);
        ::std::allocator<char>::~allocator(&local_81);
        hostname_local._M_str._7_1_ = false;
      }
      else {
        ppVar5 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::shared_ptr<libtorrent::aux::udp_tracker_connection>_>,_false,_false>
                               *)&local_58);
        ::std::shared_ptr<libtorrent::aux::udp_tracker_connection>::shared_ptr
                  ((shared_ptr<libtorrent::aux::udp_tracker_connection> *)local_a8,&ppVar5->second);
        this_00 = ::std::
                  __shared_ptr_access<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libtorrent::aux::udp_tracker_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_a8);
        hostname_00._M_str = hostname._M_str;
        hostname_00._M_len = buf_local.m_len;
        buf_00.m_len = (difference_type)buf_local.m_ptr;
        buf_00.m_ptr = (char *)this_local;
        hostname_local._M_str._7_1_ =
             udp_tracker_connection::on_receive_hostname(this_00,hostname_00,buf_00);
        ::std::shared_ptr<libtorrent::aux::udp_tracker_connection>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::udp_tracker_connection> *)local_a8);
      }
    }
    else {
      hostname_local._M_str._7_1_ = false;
    }
  }
  return hostname_local._M_str._7_1_;
}

Assistant:

bool tracker_manager::incoming_packet(string_view const hostname
		, span<char const> const buf)
	{
		TORRENT_ASSERT(is_single_thread());
		// ignore packets smaller than 8 bytes
		if (buf.size() < 16) return false;

		// the first word is the action, if it's not [0, 3]
		// it's not a valid udp tracker response
		span<const char> ptr = buf;
		std::uint32_t const action = aux::read_uint32(ptr);
		if (action > 3) return false;

		std::uint32_t const transaction = aux::read_uint32(ptr);
		auto const i = m_udp_conns.find(transaction);

		if (i == m_udp_conns.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			// now, this may not have been meant to be a tracker response,
			// but chances are pretty good, so it's probably worth logging
			m_ses.session_log("incoming UDP tracker packet from %s has invalid "
				"transaction ID (%x)", std::string(hostname).c_str(), int(transaction));
#endif
			return false;
		}

		auto const p = i->second;
		// on_receive() may remove the tracker connection from the list
		return p->on_receive_hostname(hostname, buf);
	}